

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O3

Sentence * __thiscall
jhu::thrax::split(Sentence *__return_storage_ptr__,thrax *this,string_view line)

{
  pointer *ppbVar1;
  iterator __position;
  int iVar2;
  thrax *ptVar3;
  size_t sVar4;
  long lVar5;
  size_type __n;
  thrax *ptVar6;
  thrax *ptVar7;
  thrax *ptVar8;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  sVar4 = line._M_len;
  if (this == (thrax *)0x0) {
    __n = 1;
  }
  else {
    ptVar7 = (thrax *)0x0;
    lVar5 = 0;
    do {
      iVar2 = isspace((uint)(byte)ptVar7[sVar4]);
      lVar5 = (lVar5 + 1) - (ulong)(iVar2 == 0);
      ptVar7 = ptVar7 + 1;
    } while (this != ptVar7);
    __n = lVar5 + 1;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(__return_storage_ptr__,__n);
  ptVar7 = this + sVar4;
  if (split(std::basic_string_view<char,std::char_traits<char>>)::notSpace == '\0') {
    split();
  }
  ptVar3 = (thrax *)std::find_if<char_const*,std::_Not_fn<jhu::thrax::__0>>(sVar4,ptVar7);
  if (ptVar3 < ptVar7) {
    do {
      lVar5 = (long)ptVar7 - (long)ptVar3 >> 2;
      ptVar8 = ptVar3;
      if (0 < lVar5) {
        ptVar8 = ptVar3 + ((long)ptVar7 - (long)ptVar3 & 0xfffffffffffffffc);
        lVar5 = lVar5 + 1;
        ptVar6 = ptVar3 + 3;
        do {
          iVar2 = isspace((uint)(byte)ptVar6[-3]);
          if (iVar2 != 0) {
            ptVar6 = ptVar6 + -3;
            goto LAB_00103e8e;
          }
          iVar2 = isspace((uint)(byte)ptVar6[-2]);
          if (iVar2 != 0) {
            ptVar6 = ptVar6 + -2;
            goto LAB_00103e8e;
          }
          iVar2 = isspace((uint)(byte)ptVar6[-1]);
          if (iVar2 != 0) {
            ptVar6 = ptVar6 + -1;
            goto LAB_00103e8e;
          }
          iVar2 = isspace((uint)(byte)*ptVar6);
          if (iVar2 != 0) goto LAB_00103e8e;
          lVar5 = lVar5 + -1;
          ptVar6 = ptVar6 + 4;
        } while (1 < lVar5);
      }
      lVar5 = (long)ptVar7 - (long)ptVar8;
      if (lVar5 == 1) {
LAB_00103ede:
        iVar2 = isspace((uint)(byte)*ptVar8);
        ptVar6 = ptVar8;
        if (iVar2 == 0) {
          ptVar6 = ptVar7;
        }
      }
      else {
        ptVar6 = ptVar8;
        if (lVar5 == 2) {
LAB_00103e69:
          iVar2 = isspace((uint)(byte)*ptVar6);
          if (iVar2 == 0) {
            ptVar8 = ptVar6 + 1;
            goto LAB_00103ede;
          }
        }
        else {
          ptVar6 = ptVar7;
          if ((lVar5 == 3) && (iVar2 = isspace((uint)(byte)*ptVar8), ptVar6 = ptVar8, iVar2 == 0)) {
            ptVar6 = ptVar8 + 1;
            goto LAB_00103e69;
          }
        }
      }
LAB_00103e8e:
      local_40._M_len = (long)ptVar6 - (long)ptVar3;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_40._M_str = (char *)ptVar3;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,__position,&local_40);
      }
      else {
        local_40._M_str._0_4_ = SUB84(ptVar3,0);
        local_40._M_str._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
        (__position._M_current)->_M_len = local_40._M_len;
        *(undefined4 *)&(__position._M_current)->_M_str = local_40._M_str._0_4_;
        *(undefined4 *)((long)&(__position._M_current)->_M_str + 4) = local_40._M_str._4_4_;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      ptVar3 = (thrax *)std::find_if<char_const*,std::_Not_fn<jhu::thrax::__0>>(ptVar6,ptVar7);
    } while (ptVar3 < ptVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Sentence split(std::string_view line) {
  auto spaces = std::count_if(line.begin(), line.end(), isSpace);
  Sentence result;
  result.reserve(spaces + 1);  // estimate
  static const auto notSpace = std::not_fn(isSpace);
  auto s = std::find_if(line.begin(), line.end(), notSpace);
  for (auto e = s; s < line.end(); s = std::find_if(e, line.end(), notSpace)) {
    e = std::find_if(s, line.end(), isSpace);
    size_t len = std::distance(s, e);
    result.push_back({ s, len });
  }
  return result;
}